

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

void __thiscall
CVmObjClass::load_image_data(CVmObjClass *this,vm_obj_id_t self,char *ptr,size_t siz)

{
  vm_intcls_ext *pvVar1;
  
  if (7 < siz) {
    pvVar1 = alloc_ext(this);
    pvVar1->meta_idx = (uint)*(ushort *)(ptr + 2);
    pvVar1->mod_obj = *(vm_obj_id_t *)(ptr + 4);
    (pvVar1->class_state).typ = VM_NIL;
    if (10 < siz) {
      vmb_get_dh(ptr + 8,&pvVar1->class_state);
    }
    register_meta(this,self);
    return;
  }
  err_throw(0x148);
}

Assistant:

void CVmObjClass::load_image_data(VMG_ vm_obj_id_t self,
                                  const char *ptr, size_t siz)
{
    /* make sure the length is valid */
    if (siz < 8)
        err_throw(VMERR_INVAL_METACLASS_DATA);

    /* allocate or reallocate the extension */
    vm_intcls_ext *ext = alloc_ext(vmg0_);

    /* 
     *   read the metaclass index and modifier object ID; note that modifier
     *   objects are always root set objects, so there's no need to worry
     *   about fixups 
     */
    ext->meta_idx = osrp2(ptr+2);
    ext->mod_obj = (vm_obj_id_t)t3rp4u(ptr+4);

    /* if we have a class state value, read it */
    ext->class_state.set_nil();
    if (siz >= 2+4+VMB_DATAHOLDER)
        vmb_get_dh(ptr+8, &ext->class_state);
        
    /* register myself */
    register_meta(vmg_ self);
}